

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_graph_pipeline.cpp
# Opt level: O2

int main(void)

{
  Node *pNVar1;
  Node *v;
  Node *v_00;
  FlowBuilder FVar2;
  uint uVar3;
  long lVar4;
  array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:40:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:50:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:55:36)>_>::Line,_3UL>
  *__cur;
  size_t l_1;
  ulong uVar5;
  Executor *this;
  long lVar6;
  size_t l;
  ulong uVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  allocator_type local_409;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  undefined1 local_3e8 [32];
  PipeType local_3c8 [2];
  anon_class_8_1_a85c01d1_for__callable local_3c0;
  PipeType local_3b8;
  anon_class_8_1_a85c01d1_for__callable local_3b0;
  PipeType local_3a8 [2];
  anon_class_8_1_a85c01d1_for__callable local_3a0;
  undefined8 local_398;
  PipeMeta local_390;
  pointer local_388;
  pointer paStack_380;
  pointer local_378;
  vector<tf::Task,_std::allocator<tf::Task>_> local_370;
  vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_> local_358;
  queue<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_340;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_2f0;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_2b8;
  size_t local_280;
  shared_ptr<tf::WorkerInterface> local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nodes;
  string local_250;
  Taskflow taskflow;
  Executor executor;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3e8,"graph processing pipeline",(allocator<char> *)&executor);
  tf::Taskflow::Taskflow(&taskflow,(string *)local_3e8);
  std::__cxx11::string::~string((string *)local_3e8);
  uVar3 = std::thread::hardware_concurrency();
  local_278.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_278.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)uVar3,&local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_278.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3e8,"A",(allocator<char> *)&local_430);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3c8,"B",(allocator<char> *)&local_408);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3a8,"C",(allocator<char> *)&local_250);
  __l._M_len = 3;
  __l._M_array = (iterator)local_3e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&nodes,__l,&local_409);
  lVar6 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_3e8 + lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  local_3e8._16_8_ = 0;
  local_3e8._0_8_ = (pointer)0x0;
  local_3e8._8_8_ = (pointer)0x0;
  local_3c8[0] = SERIAL;
  local_398._0_4_ = SERIAL;
  local_398._4_4_ = SERIAL;
  local_388 = (pointer)0x0;
  paStack_380 = (pointer)0x0;
  local_378 = (pointer)0x0;
  local_3c0.nodes = &nodes;
  local_3b8 = local_3c8[0];
  local_3b0.nodes = &nodes;
  local_3a8[0] = local_3c8[0];
  local_3a0.nodes = &nodes;
  local_390.type = local_3c8[0];
  local_388 = (pointer)operator_new(0x30);
  paStack_380 = local_388 + 2;
  local_388[1]._M_elems[1].join_counter.super___atomic_base<unsigned_long>._M_i = 0;
  local_388[1]._M_elems[2].join_counter.super___atomic_base<unsigned_long>._M_i = 0;
  local_388->_M_elems[2].join_counter.super___atomic_base<unsigned_long>._M_i = 0;
  local_388[1]._M_elems[0].join_counter.super___atomic_base<unsigned_long>._M_i = 0;
  local_388->_M_elems[0].join_counter.super___atomic_base<unsigned_long>._M_i = 0;
  local_388->_M_elems[1].join_counter.super___atomic_base<unsigned_long>._M_i = 0;
  local_378 = paStack_380;
  std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
            (&local_370,3,(allocator_type *)&local_430);
  std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::vector
            (&local_358,2,(allocator_type *)&local_430);
  std::
  queue<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
  ::
  queue<std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>,void>
            (&local_340);
  local_2f0._M_buckets = &local_2f0._M_single_bucket;
  uVar5 = 1;
  local_2f0._M_bucket_count = 1;
  local_2f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2f0._M_element_count = 0;
  local_2f0._M_rehash_policy._M_max_load_factor = 1.0;
  local_2f0._M_rehash_policy._M_next_resize = 0;
  local_2f0._M_single_bucket = (__node_base_ptr)0x0;
  local_2b8._M_buckets = &local_2b8._M_single_bucket;
  local_2b8._M_bucket_count = 1;
  local_2b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2b8._M_element_count = 0;
  local_2b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_280 = 0;
  local_2b8._M_rehash_policy._M_next_resize = 0;
  local_2b8._M_single_bucket = (__node_base_ptr)0x0;
  if (local_3a8[0] != SERIAL) {
    tf::throw_re<char_const(&)[26]>
              ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
               ,0x232,(char (*) [26])"first pipe must be serial");
  }
  local_3e8._24_8_ = 0;
  lVar6 = 0x28;
  uVar7 = 0;
  while( true ) {
    if ((ulong)(((long)local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x60) <= uVar7) break;
    *(undefined8 *)
     ((long)local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
            super__Vector_impl_data._M_start + lVar6 + -0x20) = 0;
    *(ulong *)((long)local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar6 + -0x28) = uVar7;
    *(undefined8 *)
     ((long)local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
            super__Vector_impl_data._M_start + lVar6 + -8) = 0;
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)((long)&(local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                        _M_impl.super__Vector_impl_data._M_start)->_line + lVar6));
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x60;
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&local_2f0);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&local_2b8);
  local_388->_M_elems[0].join_counter.super___atomic_base<unsigned_long>._M_i = 0;
  lVar6 = 0x20;
  for (; uVar5 < (ulong)(((long)local_358.
                                super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_358.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x60); uVar5 = uVar5 + 1)
  {
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      *(long *)((long)&local_388->_M_elems[lVar4].join_counter.super___atomic_base<unsigned_long>.
                       _M_i + lVar6) = (long)*(int *)((long)&local_398 + lVar4 * 4 + 4);
    }
    lVar6 = lVar6 + 0x18;
  }
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    local_388->_M_elems[lVar6 + 1].join_counter.super___atomic_base<unsigned_long>._M_i = 1;
  }
  lVar6 = 0x18;
  for (uVar5 = 1;
      uVar5 < (ulong)(((long)local_358.
                             super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)local_358.
                            super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x60); uVar5 = uVar5 + 1) {
    *(long *)((long)&local_388->_M_elems[0].join_counter.super___atomic_base<unsigned_long>._M_i +
             lVar6) = (long)(int)local_398._0_4_ + -1;
    lVar6 = lVar6 + 0x18;
  }
  local_430._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_430._M_dataplus._M_p[0] = '\0';
  local_430._M_dataplus._M_p[1] = '\0';
  local_430._M_dataplus._M_p[2] = '\0';
  local_430._M_dataplus._M_p[3] = '\0';
  local_430._M_dataplus._M_p[4] = '\0';
  local_430._M_dataplus._M_p[5] = '\0';
  local_430._M_dataplus._M_p[6] = '\0';
  local_430._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_430._M_dataplus._M_p + 8) = local_430._M_dataplus._M_p + 0x18;
  local_430._M_dataplus._M_p[0x10] = '\0';
  local_430._M_dataplus._M_p[0x11] = '\0';
  local_430._M_dataplus._M_p[0x12] = '\0';
  local_430._M_dataplus._M_p[0x13] = '\0';
  local_430._M_dataplus._M_p[0x14] = '\0';
  local_430._M_dataplus._M_p[0x15] = '\0';
  local_430._M_dataplus._M_p[0x16] = '\0';
  local_430._M_dataplus._M_p[0x17] = '\0';
  local_430._M_dataplus._M_p[0x18] = '\0';
  local_430._M_dataplus._M_p[0x28] = '\0';
  local_430._M_dataplus._M_p[0x29] = '\0';
  local_430._M_dataplus._M_p[0x2a] = '\0';
  local_430._M_dataplus._M_p[0x2b] = '\0';
  local_430._M_dataplus._M_p[0x2c] = '\0';
  local_430._M_dataplus._M_p[0x2d] = '\0';
  local_430._M_dataplus._M_p[0x2e] = '\0';
  local_430._M_dataplus._M_p[0x2f] = '\0';
  local_430._M_dataplus._M_p[0x30] = '\0';
  local_430._M_dataplus._M_p[0x31] = '\0';
  local_430._M_dataplus._M_p[0x32] = '\0';
  local_430._M_dataplus._M_p[0x33] = '\0';
  local_430._M_dataplus._M_p[0x34] = '\0';
  local_430._M_dataplus._M_p[0x35] = '\0';
  local_430._M_dataplus._M_p[0x36] = '\0';
  local_430._M_dataplus._M_p[0x37] = '\0';
  local_430._M_dataplus._M_p[0x38] = '\0';
  local_430._M_dataplus._M_p[0x39] = '\0';
  local_430._M_dataplus._M_p[0x3a] = '\0';
  local_430._M_dataplus._M_p[0x3b] = '\0';
  local_430._M_dataplus._M_p[0x3c] = '\0';
  local_430._M_dataplus._M_p[0x3d] = '\0';
  local_430._M_dataplus._M_p[0x3e] = '\0';
  local_430._M_dataplus._M_p[0x3f] = '\0';
  local_430._M_dataplus._M_p[0x40] = '\0';
  local_430._M_dataplus._M_p[0x41] = '\0';
  local_430._M_dataplus._M_p[0x42] = '\0';
  local_430._M_dataplus._M_p[0x43] = '\0';
  local_430._M_dataplus._M_p[0x44] = '\0';
  local_430._M_dataplus._M_p[0x45] = '\0';
  local_430._M_dataplus._M_p[0x46] = '\0';
  local_430._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_430._M_dataplus._M_p + 0x48) = local_430._M_dataplus._M_p + 0x60;
  *(pointer *)(local_430._M_dataplus._M_p + 0x50) = local_430._M_dataplus._M_p + 0x60;
  *(pointer *)(local_430._M_dataplus._M_p + 0x58) = local_430._M_dataplus._M_p + 0x80;
  local_430._M_dataplus._M_p[0x80] = '\0';
  local_430._M_dataplus._M_p[0x81] = '\0';
  local_430._M_dataplus._M_p[0x82] = '\0';
  local_430._M_dataplus._M_p[0x83] = '\0';
  local_430._M_dataplus._M_p[0x84] = '\0';
  local_430._M_dataplus._M_p[0x85] = '\0';
  local_430._M_dataplus._M_p[0x86] = '\0';
  local_430._M_dataplus._M_p[0x87] = '\0';
  local_430._M_dataplus._M_p[0x90] = '\0';
  local_430._M_dataplus._M_p[0x91] = '\0';
  local_430._M_dataplus._M_p[0x92] = '\0';
  local_430._M_dataplus._M_p[0x93] = '\0';
  local_430._M_dataplus._M_p[0x94] = '\0';
  local_430._M_dataplus._M_p[0x95] = '\0';
  local_430._M_dataplus._M_p[0x96] = '\0';
  local_430._M_dataplus._M_p[0x97] = '\0';
  *(vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    **)(local_430._M_dataplus._M_p + 0x88) =
       (vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
        *)local_3e8;
  *(code **)(local_430._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
       ::_M_invoke;
  *(code **)(local_430._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
       ::_M_manager;
  local_430._M_dataplus._M_p[0xc0] = '\x04';
  local_430._M_dataplus._M_p[200] = '\0';
  local_430._M_dataplus._M_p[0xc9] = '\0';
  local_430._M_dataplus._M_p[0xca] = '\0';
  local_430._M_dataplus._M_p[0xcb] = '\0';
  local_430._M_dataplus._M_p[0xcc] = '\0';
  local_430._M_dataplus._M_p[0xcd] = '\0';
  local_430._M_dataplus._M_p[0xce] = '\0';
  local_430._M_dataplus._M_p[0xcf] = '\0';
  local_430._M_dataplus._M_p[0xd0] = '\0';
  local_430._M_dataplus._M_p[0xd1] = '\0';
  local_430._M_dataplus._M_p[0xd2] = '\0';
  local_430._M_dataplus._M_p[0xd3] = '\0';
  local_430._M_dataplus._M_p[0xd4] = '\0';
  local_430._M_dataplus._M_p[0xd5] = '\0';
  local_430._M_dataplus._M_p[0xd6] = '\0';
  local_430._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)local_3e8,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_430);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_430);
  pNVar1 = (((pointer)(local_3e8._8_8_ + -8))->_M_t).
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"cond",(allocator<char> *)&local_408);
  std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
  (local_370.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.super__Vector_impl_data
  ._M_start)->_node = pNVar1;
  std::__cxx11::string::~string((string *)&local_430);
  for (uVar5 = 0; FVar2._graph = taskflow.super_FlowBuilder._graph,
      uVar5 < (ulong)(((long)local_358.
                             super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)local_358.
                            super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x60); uVar5 = uVar5 + 1) {
    local_430._M_dataplus._M_p = (pointer)operator_new(0xd8);
    local_430._M_dataplus._M_p[0] = '\0';
    local_430._M_dataplus._M_p[1] = '\0';
    local_430._M_dataplus._M_p[2] = '\0';
    local_430._M_dataplus._M_p[3] = '\0';
    local_430._M_dataplus._M_p[4] = '\0';
    local_430._M_dataplus._M_p[5] = '\0';
    local_430._M_dataplus._M_p[6] = '\0';
    local_430._M_dataplus._M_p[7] = '\0';
    *(pointer *)(local_430._M_dataplus._M_p + 8) = local_430._M_dataplus._M_p + 0x18;
    local_430._M_dataplus._M_p[0x10] = '\0';
    local_430._M_dataplus._M_p[0x11] = '\0';
    local_430._M_dataplus._M_p[0x12] = '\0';
    local_430._M_dataplus._M_p[0x13] = '\0';
    local_430._M_dataplus._M_p[0x14] = '\0';
    local_430._M_dataplus._M_p[0x15] = '\0';
    local_430._M_dataplus._M_p[0x16] = '\0';
    local_430._M_dataplus._M_p[0x17] = '\0';
    local_430._M_dataplus._M_p[0x18] = '\0';
    local_430._M_dataplus._M_p[0x28] = '\0';
    local_430._M_dataplus._M_p[0x29] = '\0';
    local_430._M_dataplus._M_p[0x2a] = '\0';
    local_430._M_dataplus._M_p[0x2b] = '\0';
    local_430._M_dataplus._M_p[0x2c] = '\0';
    local_430._M_dataplus._M_p[0x2d] = '\0';
    local_430._M_dataplus._M_p[0x2e] = '\0';
    local_430._M_dataplus._M_p[0x2f] = '\0';
    local_430._M_dataplus._M_p[0x30] = '\0';
    local_430._M_dataplus._M_p[0x31] = '\0';
    local_430._M_dataplus._M_p[0x32] = '\0';
    local_430._M_dataplus._M_p[0x33] = '\0';
    local_430._M_dataplus._M_p[0x34] = '\0';
    local_430._M_dataplus._M_p[0x35] = '\0';
    local_430._M_dataplus._M_p[0x36] = '\0';
    local_430._M_dataplus._M_p[0x37] = '\0';
    local_430._M_dataplus._M_p[0x38] = '\0';
    local_430._M_dataplus._M_p[0x39] = '\0';
    local_430._M_dataplus._M_p[0x3a] = '\0';
    local_430._M_dataplus._M_p[0x3b] = '\0';
    local_430._M_dataplus._M_p[0x3c] = '\0';
    local_430._M_dataplus._M_p[0x3d] = '\0';
    local_430._M_dataplus._M_p[0x3e] = '\0';
    local_430._M_dataplus._M_p[0x3f] = '\0';
    local_430._M_dataplus._M_p[0x40] = '\0';
    local_430._M_dataplus._M_p[0x41] = '\0';
    local_430._M_dataplus._M_p[0x42] = '\0';
    local_430._M_dataplus._M_p[0x43] = '\0';
    local_430._M_dataplus._M_p[0x44] = '\0';
    local_430._M_dataplus._M_p[0x45] = '\0';
    local_430._M_dataplus._M_p[0x46] = '\0';
    local_430._M_dataplus._M_p[0x47] = '\0';
    *(pointer *)(local_430._M_dataplus._M_p + 0x48) = local_430._M_dataplus._M_p + 0x60;
    *(pointer *)(local_430._M_dataplus._M_p + 0x50) = local_430._M_dataplus._M_p + 0x60;
    *(pointer *)(local_430._M_dataplus._M_p + 0x58) = local_430._M_dataplus._M_p + 0x80;
    local_430._M_dataplus._M_p[0x80] = '\0';
    local_430._M_dataplus._M_p[0x81] = '\0';
    local_430._M_dataplus._M_p[0x82] = '\0';
    local_430._M_dataplus._M_p[0x83] = '\0';
    local_430._M_dataplus._M_p[0x84] = '\0';
    local_430._M_dataplus._M_p[0x85] = '\0';
    local_430._M_dataplus._M_p[0x86] = '\0';
    local_430._M_dataplus._M_p[0x87] = '\0';
    *(vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      **)(local_430._M_dataplus._M_p + 0x88) =
         (vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
          *)local_3e8;
    *(ulong *)(local_430._M_dataplus._M_p + 0x90) = uVar5;
    *(code **)(local_430._M_dataplus._M_p + 0xa0) =
         std::
         _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
         ::_M_invoke;
    *(code **)(local_430._M_dataplus._M_p + 0x98) =
         std::
         _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
         ::_M_manager;
    local_430._M_dataplus._M_p[0xc0] = '\x02';
    local_430._M_dataplus._M_p[200] = '\0';
    local_430._M_dataplus._M_p[0xc9] = '\0';
    local_430._M_dataplus._M_p[0xca] = '\0';
    local_430._M_dataplus._M_p[0xcb] = '\0';
    local_430._M_dataplus._M_p[0xcc] = '\0';
    local_430._M_dataplus._M_p[0xcd] = '\0';
    local_430._M_dataplus._M_p[0xce] = '\0';
    local_430._M_dataplus._M_p[0xcf] = '\0';
    local_430._M_dataplus._M_p[0xd0] = '\0';
    local_430._M_dataplus._M_p[0xd1] = '\0';
    local_430._M_dataplus._M_p[0xd2] = '\0';
    local_430._M_dataplus._M_p[0xd3] = '\0';
    local_430._M_dataplus._M_p[0xd4] = '\0';
    local_430._M_dataplus._M_p[0xd5] = '\0';
    local_430._M_dataplus._M_p[0xd6] = '\0';
    local_430._M_dataplus._M_p[0xd7] = '\0';
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)local_3e8,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_430);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_430);
    pNVar1 = (((pointer)(local_3e8._8_8_ + -8))->_M_t).
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    s_abi_cxx11_(&local_408,"rt-",3);
    std::__cxx11::to_string(&local_250,uVar5);
    std::operator+(&local_430,&local_408,&local_250);
    std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
    local_370.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
    super__Vector_impl_data._M_start[uVar5 + 1]._node = pNVar1;
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_408);
    tf::Task::precede<tf::Task&>
              (local_370.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_370.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
               super__Vector_impl_data._M_start + uVar5 + 1);
  }
  local_430._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_430._M_dataplus._M_p[0] = '\0';
  local_430._M_dataplus._M_p[1] = '\0';
  local_430._M_dataplus._M_p[2] = '\0';
  local_430._M_dataplus._M_p[3] = '\0';
  local_430._M_dataplus._M_p[4] = '\0';
  local_430._M_dataplus._M_p[5] = '\0';
  local_430._M_dataplus._M_p[6] = '\0';
  local_430._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_430._M_dataplus._M_p + 8) = local_430._M_dataplus._M_p + 0x18;
  local_430._M_dataplus._M_p[0x10] = '\0';
  local_430._M_dataplus._M_p[0x11] = '\0';
  local_430._M_dataplus._M_p[0x12] = '\0';
  local_430._M_dataplus._M_p[0x13] = '\0';
  local_430._M_dataplus._M_p[0x14] = '\0';
  local_430._M_dataplus._M_p[0x15] = '\0';
  local_430._M_dataplus._M_p[0x16] = '\0';
  local_430._M_dataplus._M_p[0x17] = '\0';
  local_430._M_dataplus._M_p[0x18] = '\0';
  local_430._M_dataplus._M_p[0x28] = '\0';
  local_430._M_dataplus._M_p[0x29] = '\0';
  local_430._M_dataplus._M_p[0x2a] = '\0';
  local_430._M_dataplus._M_p[0x2b] = '\0';
  local_430._M_dataplus._M_p[0x2c] = '\0';
  local_430._M_dataplus._M_p[0x2d] = '\0';
  local_430._M_dataplus._M_p[0x2e] = '\0';
  local_430._M_dataplus._M_p[0x2f] = '\0';
  local_430._M_dataplus._M_p[0x30] = '\0';
  local_430._M_dataplus._M_p[0x31] = '\0';
  local_430._M_dataplus._M_p[0x32] = '\0';
  local_430._M_dataplus._M_p[0x33] = '\0';
  local_430._M_dataplus._M_p[0x34] = '\0';
  local_430._M_dataplus._M_p[0x35] = '\0';
  local_430._M_dataplus._M_p[0x36] = '\0';
  local_430._M_dataplus._M_p[0x37] = '\0';
  local_430._M_dataplus._M_p[0x38] = '\0';
  local_430._M_dataplus._M_p[0x39] = '\0';
  local_430._M_dataplus._M_p[0x3a] = '\0';
  local_430._M_dataplus._M_p[0x3b] = '\0';
  local_430._M_dataplus._M_p[0x3c] = '\0';
  local_430._M_dataplus._M_p[0x3d] = '\0';
  local_430._M_dataplus._M_p[0x3e] = '\0';
  local_430._M_dataplus._M_p[0x3f] = '\0';
  local_430._M_dataplus._M_p[0x40] = '\0';
  local_430._M_dataplus._M_p[0x41] = '\0';
  local_430._M_dataplus._M_p[0x42] = '\0';
  local_430._M_dataplus._M_p[0x43] = '\0';
  local_430._M_dataplus._M_p[0x44] = '\0';
  local_430._M_dataplus._M_p[0x45] = '\0';
  local_430._M_dataplus._M_p[0x46] = '\0';
  local_430._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_430._M_dataplus._M_p + 0x48) = local_430._M_dataplus._M_p + 0x60;
  *(pointer *)(local_430._M_dataplus._M_p + 0x50) = local_430._M_dataplus._M_p + 0x60;
  *(pointer *)(local_430._M_dataplus._M_p + 0x58) = local_430._M_dataplus._M_p + 0x80;
  local_430._M_dataplus._M_p[0x80] = '\0';
  local_430._M_dataplus._M_p[0x81] = '\0';
  local_430._M_dataplus._M_p[0x82] = '\0';
  local_430._M_dataplus._M_p[0x83] = '\0';
  local_430._M_dataplus._M_p[0x84] = '\0';
  local_430._M_dataplus._M_p[0x85] = '\0';
  local_430._M_dataplus._M_p[0x86] = '\0';
  local_430._M_dataplus._M_p[0x87] = '\0';
  local_430._M_dataplus._M_p[0x88] = '\0';
  local_430._M_dataplus._M_p[0x89] = '\0';
  local_430._M_dataplus._M_p[0x8a] = '\0';
  local_430._M_dataplus._M_p[0x8b] = '\0';
  local_430._M_dataplus._M_p[0x8c] = '\0';
  local_430._M_dataplus._M_p[0x8d] = '\0';
  local_430._M_dataplus._M_p[0x8e] = '\0';
  local_430._M_dataplus._M_p[0x8f] = '\0';
  local_430._M_dataplus._M_p[0x90] = '\0';
  local_430._M_dataplus._M_p[0x91] = '\0';
  local_430._M_dataplus._M_p[0x92] = '\0';
  local_430._M_dataplus._M_p[0x93] = '\0';
  local_430._M_dataplus._M_p[0x94] = '\0';
  local_430._M_dataplus._M_p[0x95] = '\0';
  local_430._M_dataplus._M_p[0x96] = '\0';
  local_430._M_dataplus._M_p[0x97] = '\0';
  *(code **)(local_430._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/parallel_graph_pipeline.cpp:61:36)>
       ::_M_invoke;
  *(code **)(local_430._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/parallel_graph_pipeline.cpp:61:36)>
       ::_M_manager;
  local_430._M_dataplus._M_p[0xc0] = '\x01';
  local_430._M_dataplus._M_p[200] = '\0';
  local_430._M_dataplus._M_p[0xc9] = '\0';
  local_430._M_dataplus._M_p[0xca] = '\0';
  local_430._M_dataplus._M_p[0xcb] = '\0';
  local_430._M_dataplus._M_p[0xcc] = '\0';
  local_430._M_dataplus._M_p[0xcd] = '\0';
  local_430._M_dataplus._M_p[0xce] = '\0';
  local_430._M_dataplus._M_p[0xcf] = '\0';
  local_430._M_dataplus._M_p[0xd0] = '\0';
  local_430._M_dataplus._M_p[0xd1] = '\0';
  local_430._M_dataplus._M_p[0xd2] = '\0';
  local_430._M_dataplus._M_p[0xd3] = '\0';
  local_430._M_dataplus._M_p[0xd4] = '\0';
  local_430._M_dataplus._M_p[0xd5] = '\0';
  local_430._M_dataplus._M_p[0xd6] = '\0';
  local_430._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_430);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_430);
  pNVar1 = ((FVar2._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"starting pipeline",(allocator<char> *)&local_408);
  std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
  std::__cxx11::string::~string((string *)&local_430);
  FVar2 = taskflow.super_FlowBuilder;
  local_430._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_430._M_dataplus._M_p[0] = '\0';
  local_430._M_dataplus._M_p[1] = '\0';
  local_430._M_dataplus._M_p[2] = '\0';
  local_430._M_dataplus._M_p[3] = '\0';
  local_430._M_dataplus._M_p[4] = '\0';
  local_430._M_dataplus._M_p[5] = '\0';
  local_430._M_dataplus._M_p[6] = '\0';
  local_430._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_430._M_dataplus._M_p + 8) = local_430._M_dataplus._M_p + 0x18;
  local_430._M_dataplus._M_p[0x10] = '\0';
  local_430._M_dataplus._M_p[0x11] = '\0';
  local_430._M_dataplus._M_p[0x12] = '\0';
  local_430._M_dataplus._M_p[0x13] = '\0';
  local_430._M_dataplus._M_p[0x14] = '\0';
  local_430._M_dataplus._M_p[0x15] = '\0';
  local_430._M_dataplus._M_p[0x16] = '\0';
  local_430._M_dataplus._M_p[0x17] = '\0';
  local_430._M_dataplus._M_p[0x18] = '\0';
  local_430._M_dataplus._M_p[0x28] = '\0';
  local_430._M_dataplus._M_p[0x29] = '\0';
  local_430._M_dataplus._M_p[0x2a] = '\0';
  local_430._M_dataplus._M_p[0x2b] = '\0';
  local_430._M_dataplus._M_p[0x2c] = '\0';
  local_430._M_dataplus._M_p[0x2d] = '\0';
  local_430._M_dataplus._M_p[0x2e] = '\0';
  local_430._M_dataplus._M_p[0x2f] = '\0';
  local_430._M_dataplus._M_p[0x30] = '\0';
  local_430._M_dataplus._M_p[0x31] = '\0';
  local_430._M_dataplus._M_p[0x32] = '\0';
  local_430._M_dataplus._M_p[0x33] = '\0';
  local_430._M_dataplus._M_p[0x34] = '\0';
  local_430._M_dataplus._M_p[0x35] = '\0';
  local_430._M_dataplus._M_p[0x36] = '\0';
  local_430._M_dataplus._M_p[0x37] = '\0';
  local_430._M_dataplus._M_p[0x38] = '\0';
  local_430._M_dataplus._M_p[0x39] = '\0';
  local_430._M_dataplus._M_p[0x3a] = '\0';
  local_430._M_dataplus._M_p[0x3b] = '\0';
  local_430._M_dataplus._M_p[0x3c] = '\0';
  local_430._M_dataplus._M_p[0x3d] = '\0';
  local_430._M_dataplus._M_p[0x3e] = '\0';
  local_430._M_dataplus._M_p[0x3f] = '\0';
  local_430._M_dataplus._M_p[0x40] = '\0';
  local_430._M_dataplus._M_p[0x41] = '\0';
  local_430._M_dataplus._M_p[0x42] = '\0';
  local_430._M_dataplus._M_p[0x43] = '\0';
  local_430._M_dataplus._M_p[0x44] = '\0';
  local_430._M_dataplus._M_p[0x45] = '\0';
  local_430._M_dataplus._M_p[0x46] = '\0';
  local_430._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_430._M_dataplus._M_p + 0x48) = local_430._M_dataplus._M_p + 0x60;
  *(pointer *)(local_430._M_dataplus._M_p + 0x50) = local_430._M_dataplus._M_p + 0x60;
  *(pointer *)(local_430._M_dataplus._M_p + 0x58) = local_430._M_dataplus._M_p + 0x80;
  local_430._M_dataplus._M_p[0x80] = '\0';
  local_430._M_dataplus._M_p[0x81] = '\0';
  local_430._M_dataplus._M_p[0x82] = '\0';
  local_430._M_dataplus._M_p[0x83] = '\0';
  local_430._M_dataplus._M_p[0x84] = '\0';
  local_430._M_dataplus._M_p[0x85] = '\0';
  local_430._M_dataplus._M_p[0x86] = '\0';
  local_430._M_dataplus._M_p[0x87] = '\0';
  *(undefined1 **)(local_430._M_dataplus._M_p + 0x88) = local_3e8;
  local_430._M_dataplus._M_p[0xc0] = '\x06';
  local_430._M_dataplus._M_p[200] = '\0';
  local_430._M_dataplus._M_p[0xc9] = '\0';
  local_430._M_dataplus._M_p[0xca] = '\0';
  local_430._M_dataplus._M_p[0xcb] = '\0';
  local_430._M_dataplus._M_p[0xcc] = '\0';
  local_430._M_dataplus._M_p[0xcd] = '\0';
  local_430._M_dataplus._M_p[0xce] = '\0';
  local_430._M_dataplus._M_p[0xcf] = '\0';
  local_430._M_dataplus._M_p[0xd0] = '\0';
  local_430._M_dataplus._M_p[0xd1] = '\0';
  local_430._M_dataplus._M_p[0xd2] = '\0';
  local_430._M_dataplus._M_p[0xd3] = '\0';
  local_430._M_dataplus._M_p[0xd4] = '\0';
  local_430._M_dataplus._M_p[0xd5] = '\0';
  local_430._M_dataplus._M_p[0xd6] = '\0';
  local_430._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_430);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_430);
  v = ((FVar2._graph)->
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ).
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
      super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
      super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
      super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"pipeline",(allocator<char> *)&local_408);
  std::__cxx11::string::_M_assign((string *)&v->_name);
  std::__cxx11::string::~string((string *)&local_430);
  local_430._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_430._M_dataplus._M_p[0] = '\0';
  local_430._M_dataplus._M_p[1] = '\0';
  local_430._M_dataplus._M_p[2] = '\0';
  local_430._M_dataplus._M_p[3] = '\0';
  local_430._M_dataplus._M_p[4] = '\0';
  local_430._M_dataplus._M_p[5] = '\0';
  local_430._M_dataplus._M_p[6] = '\0';
  local_430._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_430._M_dataplus._M_p + 8) = local_430._M_dataplus._M_p + 0x18;
  local_430._M_dataplus._M_p[0x10] = '\0';
  local_430._M_dataplus._M_p[0x11] = '\0';
  local_430._M_dataplus._M_p[0x12] = '\0';
  local_430._M_dataplus._M_p[0x13] = '\0';
  local_430._M_dataplus._M_p[0x14] = '\0';
  local_430._M_dataplus._M_p[0x15] = '\0';
  local_430._M_dataplus._M_p[0x16] = '\0';
  local_430._M_dataplus._M_p[0x17] = '\0';
  local_430._M_dataplus._M_p[0x18] = '\0';
  local_430._M_dataplus._M_p[0x28] = '\0';
  local_430._M_dataplus._M_p[0x29] = '\0';
  local_430._M_dataplus._M_p[0x2a] = '\0';
  local_430._M_dataplus._M_p[0x2b] = '\0';
  local_430._M_dataplus._M_p[0x2c] = '\0';
  local_430._M_dataplus._M_p[0x2d] = '\0';
  local_430._M_dataplus._M_p[0x2e] = '\0';
  local_430._M_dataplus._M_p[0x2f] = '\0';
  local_430._M_dataplus._M_p[0x30] = '\0';
  local_430._M_dataplus._M_p[0x31] = '\0';
  local_430._M_dataplus._M_p[0x32] = '\0';
  local_430._M_dataplus._M_p[0x33] = '\0';
  local_430._M_dataplus._M_p[0x34] = '\0';
  local_430._M_dataplus._M_p[0x35] = '\0';
  local_430._M_dataplus._M_p[0x36] = '\0';
  local_430._M_dataplus._M_p[0x37] = '\0';
  local_430._M_dataplus._M_p[0x38] = '\0';
  local_430._M_dataplus._M_p[0x39] = '\0';
  local_430._M_dataplus._M_p[0x3a] = '\0';
  local_430._M_dataplus._M_p[0x3b] = '\0';
  local_430._M_dataplus._M_p[0x3c] = '\0';
  local_430._M_dataplus._M_p[0x3d] = '\0';
  local_430._M_dataplus._M_p[0x3e] = '\0';
  local_430._M_dataplus._M_p[0x3f] = '\0';
  local_430._M_dataplus._M_p[0x40] = '\0';
  local_430._M_dataplus._M_p[0x41] = '\0';
  local_430._M_dataplus._M_p[0x42] = '\0';
  local_430._M_dataplus._M_p[0x43] = '\0';
  local_430._M_dataplus._M_p[0x44] = '\0';
  local_430._M_dataplus._M_p[0x45] = '\0';
  local_430._M_dataplus._M_p[0x46] = '\0';
  local_430._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_430._M_dataplus._M_p + 0x48) = local_430._M_dataplus._M_p + 0x60;
  *(pointer *)(local_430._M_dataplus._M_p + 0x50) = local_430._M_dataplus._M_p + 0x60;
  *(pointer *)(local_430._M_dataplus._M_p + 0x58) = local_430._M_dataplus._M_p + 0x80;
  local_430._M_dataplus._M_p[0x80] = '\0';
  local_430._M_dataplus._M_p[0x81] = '\0';
  local_430._M_dataplus._M_p[0x82] = '\0';
  local_430._M_dataplus._M_p[0x83] = '\0';
  local_430._M_dataplus._M_p[0x84] = '\0';
  local_430._M_dataplus._M_p[0x85] = '\0';
  local_430._M_dataplus._M_p[0x86] = '\0';
  local_430._M_dataplus._M_p[0x87] = '\0';
  local_430._M_dataplus._M_p[0x88] = '\0';
  local_430._M_dataplus._M_p[0x89] = '\0';
  local_430._M_dataplus._M_p[0x8a] = '\0';
  local_430._M_dataplus._M_p[0x8b] = '\0';
  local_430._M_dataplus._M_p[0x8c] = '\0';
  local_430._M_dataplus._M_p[0x8d] = '\0';
  local_430._M_dataplus._M_p[0x8e] = '\0';
  local_430._M_dataplus._M_p[0x8f] = '\0';
  local_430._M_dataplus._M_p[0x90] = '\0';
  local_430._M_dataplus._M_p[0x91] = '\0';
  local_430._M_dataplus._M_p[0x92] = '\0';
  local_430._M_dataplus._M_p[0x93] = '\0';
  local_430._M_dataplus._M_p[0x94] = '\0';
  local_430._M_dataplus._M_p[0x95] = '\0';
  local_430._M_dataplus._M_p[0x96] = '\0';
  local_430._M_dataplus._M_p[0x97] = '\0';
  *(code **)(local_430._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/parallel_graph_pipeline.cpp:65:36)>
       ::_M_invoke;
  *(code **)(local_430._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/parallel_graph_pipeline.cpp:65:36)>
       ::_M_manager;
  local_430._M_dataplus._M_p[0xc0] = '\x01';
  local_430._M_dataplus._M_p[200] = '\0';
  local_430._M_dataplus._M_p[0xc9] = '\0';
  local_430._M_dataplus._M_p[0xca] = '\0';
  local_430._M_dataplus._M_p[0xcb] = '\0';
  local_430._M_dataplus._M_p[0xcc] = '\0';
  local_430._M_dataplus._M_p[0xcd] = '\0';
  local_430._M_dataplus._M_p[0xce] = '\0';
  local_430._M_dataplus._M_p[0xcf] = '\0';
  local_430._M_dataplus._M_p[0xd0] = '\0';
  local_430._M_dataplus._M_p[0xd1] = '\0';
  local_430._M_dataplus._M_p[0xd2] = '\0';
  local_430._M_dataplus._M_p[0xd3] = '\0';
  local_430._M_dataplus._M_p[0xd4] = '\0';
  local_430._M_dataplus._M_p[0xd5] = '\0';
  local_430._M_dataplus._M_p[0xd6] = '\0';
  local_430._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)taskflow.super_FlowBuilder._graph,
             (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_430);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_430);
  v_00 = ((taskflow.super_FlowBuilder._graph)->
         super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         ).
         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
         super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"pipeline stopped",(allocator<char> *)&local_408);
  std::__cxx11::string::_M_assign((string *)&v_00->_name);
  std::__cxx11::string::~string((string *)&local_430);
  tf::Node::_precede(pNVar1,v);
  tf::Node::_precede(v,v_00);
  tf::Taskflow::dump(&taskflow,(ostream *)&std::cout);
  this = &executor;
  tf::Executor::run((Future<void> *)&local_430,this,&taskflow);
  std::__basic_future<void>::wait((__basic_future<void> *)&local_430,this);
  tf::Future<void>::~Future((Future<void> *)&local_430);
  tf::
  Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/parallel_graph_pipeline.cpp:40:36)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/parallel_graph_pipeline.cpp:50:36)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/parallel_graph_pipeline.cpp:55:36)>_>
  ::~Pipeline((Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:40:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:50:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_parallel_graph_pipeline_cpp:55:36)>_>
               *)local_3e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&nodes);
  tf::Executor::~Executor(&executor);
  tf::Taskflow::~Taskflow(&taskflow);
  return 0;
}

Assistant:

int main() {

  tf::Taskflow taskflow("graph processing pipeline");
  tf::Executor executor;

  const size_t num_lines = 2;

  // a topological order of the graph
  //    |-> B
  // A--|
  //    |-> C
  const std::vector<std::string> nodes = {"A", "B", "C"};

  // the pipeline consists of three serial pipes
  // and up to two concurrent scheduling tokens
  tf::Pipeline pl(num_lines,

    // first pipe calls f1
    tf::Pipe{tf::PipeType::SERIAL, [&](tf::Pipeflow& pf) {
      if(pf.token() == nodes.size()) {
        pf.stop();
      }
      else {
        f1(nodes[pf.token()]);
      }
    }},

    // second pipe calls f2
    tf::Pipe{tf::PipeType::SERIAL, [&](tf::Pipeflow& pf) {
      f2(nodes[pf.token()]);
    }},

    // third pipe calls f3
    tf::Pipe{tf::PipeType::SERIAL, [&](tf::Pipeflow& pf) {
      f3(nodes[pf.token()]);
    }}
  );

  // build the pipeline graph using composition
  tf::Task init = taskflow.emplace([](){ std::cout << "ready\n"; })
                          .name("starting pipeline");
  tf::Task task = taskflow.composed_of(pl)
                          .name("pipeline");
  tf::Task stop = taskflow.emplace([](){ std::cout << "stopped\n"; })
                          .name("pipeline stopped");

  // create task dependency
  init.precede(task);
  task.precede(stop);

  // dump the pipeline graph structure (with composition)
  taskflow.dump(std::cout);

  // run the pipeline
  executor.run(taskflow).wait();

  return 0;
}